

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeNodalMass(ChElementShellANCF_3833 *this)

{
  pointer psVar1;
  element_type *peVar2;
  
  psVar1 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8) =
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[3] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[6] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[9] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xc] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xf] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x12] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x15] + *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8);
  peVar2 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8) =
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[3] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x45] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x48] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x4b] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x4e] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x51] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x54] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x57] + *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8);
  peVar2 = psVar1[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8) =
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[6] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x48] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x81] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x84] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x87] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x8a] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x8d] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x90] + *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8);
  peVar2 = psVar1[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8) =
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[9] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x4b] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x84] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xb4] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xb7] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xba] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xbd] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xc0] + *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8);
  peVar2 = psVar1[4].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8) =
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xc] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x4e] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x87] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xb7] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xde] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xe1] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xe4] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xe7] + *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8);
  peVar2 = psVar1[5].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8) =
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xf] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x51] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x8a] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xba] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xe1] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xff] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x102] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x105] + *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8);
  peVar2 = psVar1[6].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8) =
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x12] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x54] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x8d] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xbd] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xe4] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x102] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x117] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x11a] + *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8);
  peVar2 = psVar1[7].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8) =
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x15] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x57] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x90] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xc0] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0xe7] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x105] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x11a] +
       (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
       m_storage.m_data.array[0x126] + *(double *)((long)&peVar2->super_ChNodeFEAxyzD + 8);
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeNodalMass() {
    m_nodes[0]->m_TotalMass += m_MassMatrix(0) + m_MassMatrix(3) + m_MassMatrix(6) + m_MassMatrix(9) +
                               m_MassMatrix(12) + m_MassMatrix(15) + m_MassMatrix(18) + m_MassMatrix(21);
    m_nodes[1]->m_TotalMass += m_MassMatrix(3) + m_MassMatrix(69) + m_MassMatrix(72) + m_MassMatrix(75) +
                               m_MassMatrix(78) + m_MassMatrix(81) + m_MassMatrix(84) + m_MassMatrix(87);
    m_nodes[2]->m_TotalMass += m_MassMatrix(6) + m_MassMatrix(72) + m_MassMatrix(129) + m_MassMatrix(132) +
                               m_MassMatrix(135) + m_MassMatrix(138) + m_MassMatrix(141) + m_MassMatrix(144);
    m_nodes[3]->m_TotalMass += m_MassMatrix(9) + m_MassMatrix(75) + m_MassMatrix(132) + m_MassMatrix(180) +
                               m_MassMatrix(183) + m_MassMatrix(186) + m_MassMatrix(189) + m_MassMatrix(192);
    m_nodes[4]->m_TotalMass += m_MassMatrix(12) + m_MassMatrix(78) + m_MassMatrix(135) + m_MassMatrix(183) +
                               m_MassMatrix(222) + m_MassMatrix(225) + m_MassMatrix(228) + m_MassMatrix(231);
    m_nodes[5]->m_TotalMass += m_MassMatrix(15) + m_MassMatrix(81) + m_MassMatrix(138) + m_MassMatrix(186) +
                               m_MassMatrix(225) + m_MassMatrix(255) + m_MassMatrix(258) + m_MassMatrix(261);
    m_nodes[6]->m_TotalMass += m_MassMatrix(18) + m_MassMatrix(84) + m_MassMatrix(141) + m_MassMatrix(189) +
                               m_MassMatrix(228) + m_MassMatrix(258) + m_MassMatrix(279) + m_MassMatrix(282);
    m_nodes[7]->m_TotalMass += m_MassMatrix(21) + m_MassMatrix(87) + m_MassMatrix(144) + m_MassMatrix(192) +
                               m_MassMatrix(231) + m_MassMatrix(261) + m_MassMatrix(282) + m_MassMatrix(294);
}